

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::EndTable
          (FlatBufferBuilderImpl<false> *this,uoffset_t start)

{
  FieldLoc *pFVar1;
  unsigned_short uVar2;
  int iVar3;
  type tVar4;
  type tVar5;
  unsigned_short *puVar6;
  uint8_t *puVar7;
  FieldLoc *pFVar8;
  uoffset_t *puVar9;
  unsigned_short vt2_size;
  voffset_t *vt2;
  uoffset_t *vt_offset_ptr;
  uint8_t *it_1;
  type vt_use;
  unsigned_short vt1_size;
  voffset_t *vt1;
  FieldLoc *pFStack_30;
  voffset_t pos;
  FieldLoc *field_location;
  uint8_t *it;
  uoffset_t table_object_size;
  uoffset_t local_14;
  uoffset_t vtable_offset_loc;
  uoffset_t start_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_14 = start;
  _vtable_offset_loc = this;
  if ((this->nested & 1U) == 0) {
    __assert_fail("nested",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x1a4,
                  "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                 );
  }
  table_object_size = PushElement<int,unsigned_int>(this,0);
  it._6_2_ = this->max_voffset_ + 2;
  it._4_2_ = FieldIndexToOffset(0);
  puVar6 = std::max<unsigned_short>
                     ((unsigned_short *)((long)&it + 6),(unsigned_short *)((long)&it + 4));
  this->max_voffset_ = *puVar6;
  vector_downward<unsigned_int>::fill_big(&this->buf_,(ulong)this->max_voffset_);
  it._0_4_ = table_object_size - local_14;
  if (0xffff < (uint)it) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x1b5,
                  "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                 );
  }
  puVar7 = vector_downward<unsigned_int>::data(&this->buf_);
  WriteScalar<unsigned_short>(puVar7 + 2,(unsigned_short)(uint)it);
  puVar7 = vector_downward<unsigned_int>::data(&this->buf_);
  WriteScalar<unsigned_short>(puVar7,this->max_voffset_);
  puVar7 = vector_downward<unsigned_int>::scratch_end(&this->buf_);
  for (field_location = (FieldLoc *)(puVar7 + (ulong)this->num_field_loc * -8);
      pFVar1 = field_location,
      pFVar8 = (FieldLoc *)vector_downward<unsigned_int>::scratch_end(&this->buf_), pFVar1 < pFVar8;
      field_location = field_location + 1) {
    pFStack_30 = field_location;
    vt1._6_2_ = (short)table_object_size - (short)field_location->off;
    puVar7 = vector_downward<unsigned_int>::data(&this->buf_);
    uVar2 = ReadScalar<unsigned_short>(puVar7 + (int)(uint)pFStack_30->id);
    if (uVar2 != 0) {
      __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                    ,0x1c1,
                    "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                   );
    }
    puVar7 = vector_downward<unsigned_int>::data(&this->buf_);
    WriteScalar<unsigned_short>(puVar7 + (int)(uint)pFStack_30->id,vt1._6_2_);
  }
  ClearOffsets(this);
  _vt_use = vector_downward<unsigned_int>::data(&this->buf_);
  it_1._6_2_ = ReadScalar<unsigned_short>(_vt_use);
  it_1._0_4_ = GetSizeRelative32BitRegion<false>(this);
  if ((this->dedup_vtables_ & 1U) != 0) {
    for (vt_offset_ptr = (uoffset_t *)vector_downward<unsigned_int>::scratch_data(&this->buf_);
        puVar9 = (uoffset_t *)vector_downward<unsigned_int>::scratch_end(&this->buf_),
        vt_offset_ptr < puVar9; vt_offset_ptr = vt_offset_ptr + 1) {
      puVar7 = vector_downward<unsigned_int>::data_at(&this->buf_,(ulong)*vt_offset_ptr);
      uVar2 = ReadScalar<unsigned_short>(puVar7);
      if ((it_1._6_2_ == uVar2) && (iVar3 = memcmp(puVar7,_vt_use,(ulong)it_1._6_2_), iVar3 == 0)) {
        it_1._0_4_ = *vt_offset_ptr;
        tVar4 = GetSizeRelative32BitRegion<false>(this);
        vector_downward<unsigned_int>::pop(&this->buf_,(ulong)(tVar4 - table_object_size));
        break;
      }
    }
  }
  tVar4 = (type)it_1;
  tVar5 = GetSizeRelative32BitRegion<false>(this);
  if (tVar4 == tVar5) {
    vector_downward<unsigned_int>::scratch_push_small<unsigned_int>(&this->buf_,(uint *)&it_1);
  }
  puVar7 = vector_downward<unsigned_int>::data_at
                     (&this->buf_,(ulong)table_object_size + this->length_of_64_bit_region_);
  WriteScalar<int>(puVar7,(type)it_1 - table_object_size);
  this->nested = false;
  return table_object_size;
}

Assistant:

uoffset_t EndTable(uoffset_t start) {
    // If you get this assert, a corresponding StartTable wasn't called.
    FLATBUFFERS_ASSERT(nested);
    // Write the vtable offset, which is the start of any Table.
    // We fill its value later.
    // This is relative to the end of the 32-bit region.
    const uoffset_t vtable_offset_loc =
        static_cast<uoffset_t>(PushElement<soffset_t>(0));
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    // Include space for the last offset and ensure empty tables have a
    // minimum size.
    max_voffset_ =
        (std::max)(static_cast<voffset_t>(max_voffset_ + sizeof(voffset_t)),
                   FieldIndexToOffset(0));
    buf_.fill_big(max_voffset_);
    const uoffset_t table_object_size = vtable_offset_loc - start;
    // Vtable use 16bit offsets.
    FLATBUFFERS_ASSERT(table_object_size < 0x10000);
    WriteScalar<voffset_t>(buf_.data() + sizeof(voffset_t),
                           static_cast<voffset_t>(table_object_size));
    WriteScalar<voffset_t>(buf_.data(), max_voffset_);
    // Write the offsets into the table
    for (auto it = buf_.scratch_end() - num_field_loc * sizeof(FieldLoc);
         it < buf_.scratch_end(); it += sizeof(FieldLoc)) {
      auto field_location = reinterpret_cast<FieldLoc *>(it);
      const voffset_t pos =
          static_cast<voffset_t>(vtable_offset_loc - field_location->off);
      // If this asserts, it means you've set a field twice.
      FLATBUFFERS_ASSERT(
          !ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    ClearOffsets();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = ReadScalar<voffset_t>(vt1);
    auto vt_use = GetSizeRelative32BitRegion();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    if (dedup_vtables_) {
      for (auto it = buf_.scratch_data(); it < buf_.scratch_end();
           it += sizeof(uoffset_t)) {
        auto vt_offset_ptr = reinterpret_cast<uoffset_t *>(it);
        auto vt2 = reinterpret_cast<voffset_t *>(buf_.data_at(*vt_offset_ptr));
        auto vt2_size = ReadScalar<voffset_t>(vt2);
        if (vt1_size != vt2_size || 0 != memcmp(vt2, vt1, vt1_size)) continue;
        vt_use = *vt_offset_ptr;
        buf_.pop(GetSizeRelative32BitRegion() - vtable_offset_loc);
        break;
      }
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSizeRelative32BitRegion()) {
      buf_.scratch_push_small(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the vtable is
    // stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtable_offset_loc + length_of_64_bit_region_),
                static_cast<soffset_t>(vt_use) -
                    static_cast<soffset_t>(vtable_offset_loc));
    nested = false;
    return vtable_offset_loc;
  }